

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGeneric.cpp
# Opt level: O1

ChVariablesGeneric * __thiscall
chrono::ChVariablesGeneric::operator=(ChVariablesGeneric *this,ChVariablesGeneric *other)

{
  assign_op<double,_double> local_12;
  assign_op<double,_double> local_11;
  
  if (other != this) {
    ChVariables::operator=(&this->super_ChVariables,&other->super_ChVariables);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
              (&this->Mmass,&other->Mmass,&local_12);
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
              (&this->inv_Mmass,&other->inv_Mmass,&local_11);
  }
  return this;
}

Assistant:

ChVariablesGeneric& ChVariablesGeneric::operator=(const ChVariablesGeneric& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChVariables::operator=(other);

    Mmass = other.Mmass;
    inv_Mmass = other.inv_Mmass;

    return *this;
}